

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O1

void idtx32x8_sse4_1(__m128i *in,__m128i *out,int bit,int col_num)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  lVar6 = 0;
  do {
    piVar1 = (int *)((long)*in + lVar6);
    iVar3 = piVar1[1];
    iVar4 = piVar1[2];
    iVar5 = piVar1[3];
    piVar2 = (int *)((long)*out + lVar6);
    *piVar2 = *piVar1 * 2;
    piVar2[1] = iVar3 * 2;
    piVar2[2] = iVar4 * 2;
    piVar2[3] = iVar5 * 2;
    piVar1 = (int *)((long)in[8] + lVar6);
    iVar3 = piVar1[1];
    iVar4 = piVar1[2];
    iVar5 = piVar1[3];
    piVar2 = (int *)((long)out[8] + lVar6);
    *piVar2 = *piVar1 * 2;
    piVar2[1] = iVar3 * 2;
    piVar2[2] = iVar4 * 2;
    piVar2[3] = iVar5 * 2;
    piVar1 = (int *)((long)in[0x10] + lVar6);
    iVar3 = piVar1[1];
    iVar4 = piVar1[2];
    iVar5 = piVar1[3];
    piVar2 = (int *)((long)out[0x10] + lVar6);
    *piVar2 = *piVar1 * 2;
    piVar2[1] = iVar3 * 2;
    piVar2[2] = iVar4 * 2;
    piVar2[3] = iVar5 * 2;
    piVar1 = (int *)((long)in[0x18] + lVar6);
    iVar3 = piVar1[1];
    iVar4 = piVar1[2];
    iVar5 = piVar1[3];
    piVar2 = (int *)((long)out[0x18] + lVar6);
    *piVar2 = *piVar1 * 2;
    piVar2[1] = iVar3 * 2;
    piVar2[2] = iVar4 * 2;
    piVar2[3] = iVar5 * 2;
    piVar1 = (int *)((long)in[0x20] + lVar6);
    iVar3 = piVar1[1];
    iVar4 = piVar1[2];
    iVar5 = piVar1[3];
    piVar2 = (int *)((long)out[0x20] + lVar6);
    *piVar2 = *piVar1 * 2;
    piVar2[1] = iVar3 * 2;
    piVar2[2] = iVar4 * 2;
    piVar2[3] = iVar5 * 2;
    piVar1 = (int *)((long)in[0x28] + lVar6);
    iVar3 = piVar1[1];
    iVar4 = piVar1[2];
    iVar5 = piVar1[3];
    piVar2 = (int *)((long)out[0x28] + lVar6);
    *piVar2 = *piVar1 * 2;
    piVar2[1] = iVar3 * 2;
    piVar2[2] = iVar4 * 2;
    piVar2[3] = iVar5 * 2;
    piVar1 = (int *)((long)in[0x30] + lVar6);
    iVar3 = piVar1[1];
    iVar4 = piVar1[2];
    iVar5 = piVar1[3];
    piVar2 = (int *)((long)out[0x30] + lVar6);
    *piVar2 = *piVar1 * 2;
    piVar2[1] = iVar3 * 2;
    piVar2[2] = iVar4 * 2;
    piVar2[3] = iVar5 * 2;
    piVar1 = (int *)((long)in[0x38] + lVar6);
    iVar3 = piVar1[1];
    iVar4 = piVar1[2];
    iVar5 = piVar1[3];
    piVar2 = (int *)((long)out[0x38] + lVar6);
    *piVar2 = *piVar1 * 2;
    piVar2[1] = iVar3 * 2;
    piVar2[2] = iVar4 * 2;
    piVar2[3] = iVar5 * 2;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 == 0x10);
  return;
}

Assistant:

static void idtx32x8_sse4_1(__m128i *in, __m128i *out, int bit, int col_num) {
  (void)bit;
  (void)col_num;
  for (int j = 0; j < 2; j++) {
    out[j + 8 * 0] = _mm_add_epi32(in[j + 8 * 0], in[j + 8 * 0]);
    out[j + 8 * 1] = _mm_add_epi32(in[j + 8 * 1], in[j + 8 * 1]);
    out[j + 8 * 2] = _mm_add_epi32(in[j + 8 * 2], in[j + 8 * 2]);
    out[j + 8 * 3] = _mm_add_epi32(in[j + 8 * 3], in[j + 8 * 3]);
    out[j + 8 * 4] = _mm_add_epi32(in[j + 8 * 4], in[j + 8 * 4]);
    out[j + 8 * 5] = _mm_add_epi32(in[j + 8 * 5], in[j + 8 * 5]);
    out[j + 8 * 6] = _mm_add_epi32(in[j + 8 * 6], in[j + 8 * 6]);
    out[j + 8 * 7] = _mm_add_epi32(in[j + 8 * 7], in[j + 8 * 7]);
  }
}